

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O2

JSValue js_os_kill(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int iVar1;
  JSValueUnion JVar2;
  ulong uVar3;
  int64_t iVar4;
  JSValue JVar5;
  int sig;
  int pid;
  
  iVar1 = JS_ToInt32(ctx,&pid,*argv);
  iVar4 = 6;
  if (iVar1 == 0) {
    iVar1 = JS_ToInt32(ctx,&sig,argv[1]);
    if (iVar1 == 0) {
      iVar1 = kill(pid,sig);
      uVar3 = js_get_errno((long)iVar1);
      JVar2.ptr = (void *)(uVar3 & 0xffffffff);
      iVar4 = 0;
      goto LAB_001121fc;
    }
  }
  JVar2.float64 = 0.0;
LAB_001121fc:
  JVar5.tag = iVar4;
  JVar5.u.float64 = JVar2.float64;
  return JVar5;
}

Assistant:

static JSValue js_os_kill(JSContext *ctx, JSValueConst this_val,
                          int argc, JSValueConst *argv)
{
    int pid, sig, ret;
    
    if (JS_ToInt32(ctx, &pid, argv[0]))
        return JS_EXCEPTION;
    if (JS_ToInt32(ctx, &sig, argv[1]))
        return JS_EXCEPTION;
    ret = js_get_errno(kill(pid, sig));
    return JS_NewInt32(ctx, ret);
}